

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *cols,size_t row)

{
  bool bVar1;
  reference pSVar2;
  reference pvVar3;
  ulong uVar4;
  ostream *poVar5;
  Colour local_af;
  Colour local_ae;
  Colour local_ad [13];
  undefined1 local_a0 [8];
  string value;
  SummaryColumn col;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *__range1;
  size_t row_local;
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *cols_local;
  string *label_local;
  ConsoleReporter *this_local;
  
  __end1 = clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::begin
                     (cols);
  col.rows.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::end
                          (cols);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
                                     *)&col.rows.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
  {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
             ::operator*(&__end1);
    SummaryColumn::SummaryColumn((SummaryColumn *)((long)&value.field_2 + 8),pSVar2);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&col.colour,row);
    std::__cxx11::string::string((string *)local_a0,(string *)pvVar3);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"0");
      if (bVar1) {
        poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
        Colour::Colour(&local_ae,FileName);
        poVar5 = Catch::operator<<(poVar5,&local_ae);
        std::operator<<(poVar5," | ");
        Colour::~Colour(&local_ae);
        poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
        Colour::Colour(&local_af,col.label.field_2._8_4_);
        poVar5 = Catch::operator<<(poVar5,&local_af);
        poVar5 = std::operator<<(poVar5,(string *)local_a0);
        poVar5 = std::operator<<(poVar5,' ');
        std::operator<<(poVar5,(string *)(value.field_2._M_local_buf + 8));
        Colour::~Colour(&local_af);
      }
    }
    else {
      poVar5 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                               (string *)label);
      std::operator<<(poVar5,": ");
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"0");
      if (bVar1) {
        std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                        (string *)local_a0);
      }
      else {
        poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
        Colour::Colour(local_ad,BrightYellow);
        poVar5 = Catch::operator<<(poVar5,local_ad);
        std::operator<<(poVar5,"- none -");
        Colour::~Colour(local_ad);
      }
    }
    std::__cxx11::string::~string((string *)local_a0);
    SummaryColumn::~SummaryColumn((SummaryColumn *)((long)&value.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryRow(std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row) {
    for (auto col : cols) {
        std::string value = col.rows[row];
        if (col.label.empty()) {
            stream << label << ": ";
            if (value != "0")
                stream << value;
            else
                stream << Colour(Colour::Warning) << "- none -";
        } else if (value != "0") {
            stream << Colour(Colour::LightGrey) << " | ";
            stream << Colour(col.colour)
                << value << ' ' << col.label;
        }
    }
    stream << '\n';
}